

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O3

curl_slist * ossl_engines_list(Curl_easy *data)

{
  ENGINE *e;
  char *data_00;
  curl_slist *pcVar1;
  curl_slist *list;
  
  e = ENGINE_get_first();
  if (e == (ENGINE *)0x0) {
LAB_0016a1c8:
    pcVar1 = (curl_slist *)0x0;
  }
  else {
    list = (curl_slist *)0x0;
    do {
      data_00 = ENGINE_get_id(e);
      pcVar1 = curl_slist_append(list,data_00);
      if (pcVar1 == (curl_slist *)0x0) {
        curl_slist_free_all(list);
        goto LAB_0016a1c8;
      }
      e = ENGINE_get_next(e);
      list = pcVar1;
    } while (e != (ENGINE *)0x0);
  }
  return pcVar1;
}

Assistant:

static struct curl_slist *ossl_engines_list(struct Curl_easy *data)
{
  struct curl_slist *list = NULL;
#ifdef USE_OPENSSL_ENGINE
  struct curl_slist *beg;
  ENGINE *e;

  for(e = ENGINE_get_first(); e; e = ENGINE_get_next(e)) {
    beg = curl_slist_append(list, ENGINE_get_id(e));
    if(!beg) {
      curl_slist_free_all(list);
      return NULL;
    }
    list = beg;
  }
#endif
  (void) data;
  return list;
}